

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O2

civil_lookup * __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::MakeTime
          (civil_lookup *__return_storage_ptr__,TimeZoneInfo *this,civil_second *cs)

{
  byte bVar1;
  Transition *pTVar2;
  Transition *pTVar3;
  ulong uVar4;
  pointer pTVar5;
  detail *pdVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  Transition *tr;
  diff_t dVar11;
  long lVar12;
  civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> cVar13;
  fields local_60;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined8 local_40;
  undefined4 local_38;
  undefined1 local_34;
  
  pTVar2 = (this->transitions_).
           super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar3 = (this->transitions_).
           super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar12 = (long)pTVar3 - (long)pTVar2;
  if (lVar12 == 0) {
    __assert_fail("timecnt != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/time/internal/cctz/src/time_zone_info.cc"
                  ,0x39f,
                  "virtual time_zone::civil_lookup absl::time_internal::cctz::TimeZoneInfo::MakeTime(const civil_second &) const"
                 );
  }
  bVar10 = detail::operator<(cs,&pTVar2->civil_sec);
  tr = pTVar2;
  if (!bVar10) {
    tr = (Transition *)(lVar12 + (long)pTVar2);
    bVar10 = detail::operator>=(cs,(civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                                    *)((long)(this->transitions_).
                                             super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                                             ._M_impl.super__Vector_impl_data._M_start +
                                      lVar12 + -0x20));
    if (!bVar10) {
      uVar4 = (this->time_local_hint_).super___atomic_base<unsigned_long>._M_i;
      if ((uVar4 != 0) && (uVar4 < (ulong)(((long)pTVar3 - (long)pTVar2) / 0x30))) {
        bVar10 = detail::operator<=(&(this->transitions_).
                                     super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar4 - 1].civil_sec,
                                    cs);
        if (bVar10) {
          bVar10 = detail::operator<(cs,&(this->transitions_).
                                         super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar4].civil_sec)
          ;
          if (bVar10) {
            tr = pTVar2 + uVar4;
            goto LAB_0031bead;
          }
        }
      }
      local_60._0_9_ = ZEXT89(0);
      local_50 = (undefined4)(cs->f_).y;
      uStack_4c = *(undefined4 *)((long)&(cs->f_).y + 4);
      uStack_48._0_1_ = (cs->f_).m;
      uStack_48._1_1_ = (cs->f_).d;
      uStack_48._2_1_ = (cs->f_).hh;
      uStack_48._3_1_ = (cs->f_).mm;
      uStack_44 = *(undefined4 *)&(cs->f_).ss;
      local_40 = 0x7b2;
      local_38 = 0x101;
      local_34 = 0;
      tr = std::
           __upper_bound<absl::lts_20250127::time_internal::cctz::Transition_const*,absl::lts_20250127::time_internal::cctz::Transition,__gnu_cxx::__ops::_Val_comp_iter<absl::lts_20250127::time_internal::cctz::Transition::ByCivilTime>>
                     (pTVar2,tr);
      (this->time_local_hint_).super___atomic_base<unsigned_long>._M_i =
           ((long)tr - (long)pTVar2) / 0x30;
    }
LAB_0031bead:
    if (tr != pTVar2) {
      if (tr == pTVar3) {
        bVar10 = detail::operator<(&tr[-1].prev_civil_sec,cs);
        if (!bVar10) {
LAB_0031bfe8:
          anon_unknown_0::MakeRepeated(__return_storage_ptr__,tr + -1,cs);
          return __return_storage_ptr__;
        }
        if (this->extended_ == true) {
          lVar12 = (cs->f_).y;
          if (this->last_year_ < lVar12) {
            lVar12 = (lVar12 + ~this->last_year_) / 400 + 1;
            local_60 = (fields)anon_unknown_0::YearShift(cs,lVar12 * -400);
            TimeLocal(__return_storage_ptr__,this,(civil_second *)&local_60,lVar12);
            return __return_storage_ptr__;
          }
        }
        bVar10 = detail::operator<(&(this->transition_types_).
                                    super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
                                    ._M_impl.super__Vector_impl_data._M_start[tr[-1].type_index].
                                    civil_max,cs);
        if (bVar10) {
          __return_storage_ptr__->kind = UNIQUE;
          dVar11 = 0x7fffffffffffffff;
          goto LAB_0031c04e;
        }
      }
      else {
        bVar10 = detail::operator<(&tr->prev_civil_sec,cs);
        if (bVar10) goto LAB_0031bf27;
        bVar10 = detail::operator<=(cs,&tr[-1].prev_civil_sec);
        if (bVar10) goto LAB_0031bfe8;
      }
      uVar8._0_1_ = (cs->f_).m;
      uVar8._1_1_ = (cs->f_).d;
      uVar8._2_1_ = (cs->f_).hh;
      uVar8._3_1_ = (cs->f_).mm;
      uVar8._4_1_ = (cs->f_).ss;
      uVar8._5_3_ = *(undefined3 *)&(cs->f_).field_0xd;
      lVar12 = tr[-1].unix_time;
      uVar9._0_1_ = tr[-1].civil_sec.f_.m;
      uVar9._1_1_ = tr[-1].civil_sec.f_.d;
      uVar9._2_1_ = tr[-1].civil_sec.f_.hh;
      uVar9._3_1_ = tr[-1].civil_sec.f_.mm;
      uVar9._4_1_ = tr[-1].civil_sec.f_.ss;
      uVar9._5_3_ = *(undefined3 *)&tr[-1].civil_sec.f_.field_0xd;
      dVar11 = detail::difference((detail *)(cs->f_).y,uVar8,tr[-1].civil_sec.f_.y,uVar9);
      __return_storage_ptr__->kind = UNIQUE;
      dVar11 = dVar11 + lVar12;
      goto LAB_0031c04e;
    }
  }
  bVar10 = detail::operator>=(&tr->prev_civil_sec,cs);
  if (!bVar10) {
LAB_0031bf27:
    anon_unknown_0::MakeSkipped(__return_storage_ptr__,tr,cs);
    return __return_storage_ptr__;
  }
  bVar1 = this->default_transition_type_;
  pTVar5 = (this->transition_types_).
           super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar10 = detail::operator<(cs,&pTVar5[bVar1].civil_min);
  if (bVar10) {
    __return_storage_ptr__->kind = UNIQUE;
    dVar11 = -0x8000000000000000;
  }
  else {
    pdVar6 = (detail *)(cs->f_).y;
    uVar7._0_1_ = (cs->f_).m;
    uVar7._1_1_ = (cs->f_).d;
    uVar7._2_1_ = (cs->f_).hh;
    uVar7._3_1_ = (cs->f_).mm;
    uVar7._4_1_ = (cs->f_).ss;
    uVar7._5_3_ = *(undefined3 *)&(cs->f_).field_0xd;
    cVar13.f_.m = '\x01';
    cVar13.f_.d = '\x01';
    cVar13.f_.hh = '\0';
    cVar13.f_.mm = '\0';
    cVar13.f_.ss = '\0';
    cVar13.f_._13_3_ = 0;
    cVar13.f_.y = 0x7b2;
    cVar13 = detail::operator+(cVar13,(long)pTVar5[bVar1].utc_offset);
    dVar11 = detail::difference(pdVar6,uVar7,cVar13.f_.y,cVar13.f_._8_8_);
    __return_storage_ptr__->kind = UNIQUE;
  }
LAB_0031c04e:
  (__return_storage_ptr__->post).__d.__r = dVar11;
  (__return_storage_ptr__->trans).__d.__r = dVar11;
  (__return_storage_ptr__->pre).__d.__r = dVar11;
  return __return_storage_ptr__;
}

Assistant:

time_zone::civil_lookup TimeZoneInfo::MakeTime(const civil_second& cs) const {
  const std::size_t timecnt = transitions_.size();
  assert(timecnt != 0);  // We always add a transition.

  // Find the first transition after our target civil time.
  const Transition* tr = nullptr;
  const Transition* begin = &transitions_[0];
  const Transition* end = begin + timecnt;
  if (cs < begin->civil_sec) {
    tr = begin;
  } else if (cs >= transitions_[timecnt - 1].civil_sec) {
    tr = end;
  } else {
    const std::size_t hint = time_local_hint_.load(std::memory_order_relaxed);
    if (0 < hint && hint < timecnt) {
      if (transitions_[hint - 1].civil_sec <= cs) {
        if (cs < transitions_[hint].civil_sec) {
          tr = begin + hint;
        }
      }
    }
    if (tr == nullptr) {
      const Transition target = {0, 0, cs, civil_second()};
      tr = std::upper_bound(begin, end, target, Transition::ByCivilTime());
      time_local_hint_.store(static_cast<std::size_t>(tr - begin),
                             std::memory_order_relaxed);
    }
  }

  if (tr == begin) {
    if (tr->prev_civil_sec >= cs) {
      // Before first transition, so use the default offset.
      const TransitionType& tt(transition_types_[default_transition_type_]);
      if (cs < tt.civil_min) return MakeUnique(time_point<seconds>::min());
      return MakeUnique(cs - (civil_second() + tt.utc_offset));
    }
    // tr->prev_civil_sec < cs < tr->civil_sec
    return MakeSkipped(*tr, cs);
  }

  if (tr == end) {
    if (cs > (--tr)->prev_civil_sec) {
      // After the last transition. If we extended the transitions using
      // future_spec_, shift back to a supported year using the 400-year
      // cycle of calendaric equivalence and then compensate accordingly.
      if (extended_ && cs.year() > last_year_) {
        const year_t shift = (cs.year() - last_year_ - 1) / 400 + 1;
        return TimeLocal(YearShift(cs, shift * -400), shift);
      }
      const TransitionType& tt(transition_types_[tr->type_index]);
      if (cs > tt.civil_max) return MakeUnique(time_point<seconds>::max());
      return MakeUnique(tr->unix_time + (cs - tr->civil_sec));
    }
    // tr->civil_sec <= cs <= tr->prev_civil_sec
    return MakeRepeated(*tr, cs);
  }

  if (tr->prev_civil_sec < cs) {
    // tr->prev_civil_sec < cs < tr->civil_sec
    return MakeSkipped(*tr, cs);
  }

  if (cs <= (--tr)->prev_civil_sec) {
    // tr->civil_sec <= cs <= tr->prev_civil_sec
    return MakeRepeated(*tr, cs);
  }

  // In between transitions.
  return MakeUnique(tr->unix_time + (cs - tr->civil_sec));
}